

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastpackwithoutmask3_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  
  uVar1 = *in;
  *out = uVar1;
  uVar1 = in[1] << 3 | uVar1;
  *out = uVar1;
  uVar1 = in[2] << 6 | uVar1;
  *out = uVar1;
  uVar1 = in[3] << 9 | uVar1;
  *out = uVar1;
  uVar1 = in[4] << 0xc | uVar1;
  *out = uVar1;
  uVar1 = in[5] << 0xf | uVar1;
  *out = uVar1;
  uVar1 = in[6] << 0x12 | uVar1;
  *out = uVar1;
  *out = in[7] << 0x15 | uVar1;
  return out + 1;
}

Assistant:

uint32_t *__fastpackwithoutmask3_8(const uint32_t *__restrict__ in,
                                   uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 3;
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 9;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 15;
  ++in;
  *out |= ((*in)) << 18;
  ++in;
  *out |= ((*in)) << 21;
  ++in;

  return out + 1;
}